

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
               (char spec,float_spec_handler<char> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  switch(iVar1) {
  case 0x41:
switchD_001341e1_caseD_61:
    if (handler->type != 'A') {
      return;
    }
    break;
  case 0x42:
  case 0x43:
  case 0x44:
switchD_001341e1_caseD_62:
    float_spec_handler<char>::on_error(handler);
    return;
  case 0x45:
switchD_001341e1_caseD_65:
    if (handler->type != 'E') {
      return;
    }
    break;
  case 0x46:
switchD_001341e1_caseD_66:
    if (handler->type != 'F') {
      return;
    }
    break;
  default:
    switch(iVar1) {
    case 0x61:
      goto switchD_001341e1_caseD_61;
    case 0x62:
    case 99:
    case 100:
      goto switchD_001341e1_caseD_62;
    case 0x65:
      goto switchD_001341e1_caseD_65;
    case 0x66:
      goto switchD_001341e1_caseD_66;
    case 0x67:
      break;
    default:
      if (iVar1 != 0) goto switchD_001341e1_caseD_62;
    }
  case 0x47:
    if (handler->type != 'G') {
      handler->type = 'g';
      return;
    }
  }
  handler->upper = true;
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(Char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}